

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cft1st(int n,double *a,double *w)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar5 = *a + a[2];
  dVar6 = a[1] + a[3];
  dVar3 = *a - a[2];
  dVar2 = a[1] - a[3];
  dVar7 = a[4] + a[6];
  dVar9 = a[5] + a[7];
  dVar4 = a[4] - a[6];
  dVar8 = a[5] - a[7];
  *a = dVar5 + dVar7;
  a[1] = dVar6 + dVar9;
  a[4] = dVar5 - dVar7;
  a[5] = dVar6 - dVar9;
  a[2] = dVar3 - dVar8;
  a[3] = dVar2 + dVar4;
  a[6] = dVar8 + dVar3;
  a[7] = dVar2 - dVar4;
  dVar2 = w[2];
  dVar7 = a[8] + a[10];
  dVar8 = a[9] + a[0xb];
  dVar3 = a[8] - a[10];
  dVar5 = a[9] - a[0xb];
  dVar9 = a[0xc] + a[0xe];
  dVar11 = a[0xd] + a[0xf];
  dVar4 = a[0xc] - a[0xe];
  dVar6 = a[0xd] - a[0xf];
  a[8] = dVar7 + dVar9;
  a[9] = dVar8 + dVar11;
  a[0xc] = dVar11 - dVar8;
  a[0xd] = dVar7 - dVar9;
  dVar7 = dVar3 - dVar6;
  dVar8 = dVar5 + dVar4;
  a[10] = (dVar7 - dVar8) * dVar2;
  a[0xb] = (dVar8 + dVar7) * dVar2;
  dVar6 = dVar6 + dVar3;
  dVar4 = dVar4 - dVar5;
  a[0xe] = (dVar4 - dVar6) * dVar2;
  a[0xf] = (dVar4 + dVar6) * dVar2;
  if (0x10 < n) {
    uVar1 = 0x10;
    do {
      dVar2 = *(double *)((long)w + uVar1);
      dVar3 = *(double *)((long)w + uVar1 + 8);
      dVar4 = *(double *)((long)w + uVar1 * 2);
      dVar5 = *(double *)((long)w + uVar1 * 2 + 8);
      dVar9 = dVar4 - (dVar3 + dVar3) * dVar5;
      dVar13 = a[uVar1] + a[uVar1 + 2];
      dVar14 = a[uVar1 + 1] + a[uVar1 + 3];
      dVar10 = a[uVar1] - a[uVar1 + 2];
      dVar8 = a[uVar1 + 1] - a[uVar1 + 3];
      dVar15 = a[uVar1 + 4] + a[uVar1 + 6];
      dVar16 = a[uVar1 + 5] + a[uVar1 + 7];
      dVar12 = a[uVar1 + 4] - a[uVar1 + 6];
      dVar11 = a[uVar1 + 5] - a[uVar1 + 7];
      a[uVar1] = dVar13 + dVar15;
      a[uVar1 + 1] = dVar14 + dVar16;
      dVar6 = dVar8 + dVar12;
      dVar7 = (dVar3 + dVar3) * dVar4 - dVar5;
      dVar13 = dVar13 - dVar15;
      dVar14 = dVar14 - dVar16;
      a[uVar1 + 4] = dVar2 * dVar13 - dVar14 * dVar3;
      a[uVar1 + 5] = dVar13 * dVar3 + dVar2 * dVar14;
      dVar13 = dVar10 - dVar11;
      a[uVar1 + 2] = dVar4 * dVar13 - dVar6 * dVar5;
      a[uVar1 + 3] = dVar6 * dVar4 + dVar13 * dVar5;
      dVar11 = dVar11 + dVar10;
      dVar8 = dVar8 - dVar12;
      a[uVar1 + 6] = dVar9 * dVar11 - dVar8 * dVar7;
      a[uVar1 + 7] = dVar8 * dVar9 + dVar11 * dVar7;
      dVar11 = a[uVar1 + 8] + a[uVar1 + 10];
      dVar12 = a[uVar1 + 9] + a[uVar1 + 0xb];
      dVar15 = a[uVar1 + 0xc] + a[uVar1 + 0xe];
      dVar6 = a[uVar1 + 0xd] + a[uVar1 + 0xf];
      dVar10 = dVar11 - dVar15;
      dVar13 = dVar12 - dVar6;
      dVar4 = *(double *)((long)w + uVar1 * 2 + 0x18);
      dVar5 = *(double *)((long)w + uVar1 * 2 + 0x10);
      dVar9 = dVar5 - (dVar2 + dVar2) * dVar4;
      dVar16 = a[uVar1 + 8] - a[uVar1 + 10];
      dVar7 = a[uVar1 + 9] - a[uVar1 + 0xb];
      dVar14 = a[uVar1 + 0xc] - a[uVar1 + 0xe];
      dVar8 = a[uVar1 + 0xd] - a[uVar1 + 0xf];
      a[uVar1 + 8] = dVar11 + dVar15;
      a[uVar1 + 9] = dVar12 + dVar6;
      a[uVar1 + 0xc] = -dVar3 * dVar10 - dVar13 * dVar2;
      dVar6 = dVar7 + dVar14;
      a[uVar1 + 0xd] = dVar10 * dVar2 - dVar3 * dVar13;
      dVar3 = dVar16 - dVar8;
      a[uVar1 + 10] = dVar5 * dVar3 - dVar6 * dVar4;
      dVar2 = (dVar2 + dVar2) * dVar5 - dVar4;
      a[uVar1 + 0xb] = dVar6 * dVar5 + dVar3 * dVar4;
      dVar8 = dVar8 + dVar16;
      dVar7 = dVar7 - dVar14;
      a[uVar1 + 0xe] = dVar9 * dVar8 - dVar7 * dVar2;
      a[uVar1 + 0xf] = dVar7 * dVar9 + dVar8 * dVar2;
      uVar1 = uVar1 + 0x10;
    } while (uVar1 < (uint)n);
  }
  return;
}

Assistant:

void cft1st(int n, double *a, double *w)
{
    int j, k1, k2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    x0r = a[0] + a[2];
    x0i = a[1] + a[3];
    x1r = a[0] - a[2];
    x1i = a[1] - a[3];
    x2r = a[4] + a[6];
    x2i = a[5] + a[7];
    x3r = a[4] - a[6];
    x3i = a[5] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
    wk1r = w[2];
    x0r = a[8] + a[10];
    x0i = a[9] + a[11];
    x1r = a[8] - a[10];
    x1i = a[9] - a[11];
    x2r = a[12] + a[14];
    x2i = a[13] + a[15];
    x3r = a[12] - a[14];
    x3i = a[13] - a[15];
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[12] = x2i - x0i;
    a[13] = x0r - x2r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[10] = wk1r * (x0r - x0i);
    a[11] = wk1r * (x0r + x0i);
    x0r = x3i + x1r;
    x0i = x3r - x1i;
    a[14] = wk1r * (x0i - x0r);
    a[15] = wk1r * (x0i + x0r);
    k1 = 0;
    for (j = 16; j < n; j += 16) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        x0r = a[j] + a[j + 2];
        x0i = a[j + 1] + a[j + 3];
        x1r = a[j] - a[j + 2];
        x1i = a[j + 1] - a[j + 3];
        x2r = a[j + 4] + a[j + 6];
        x2i = a[j + 5] + a[j + 7];
        x3r = a[j + 4] - a[j + 6];
        x3i = a[j + 5] - a[j + 7];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 4] = wk2r * x0r - wk2i * x0i;
        a[j + 5] = wk2r * x0i + wk2i * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 2] = wk1r * x0r - wk1i * x0i;
        a[j + 3] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 6] = wk3r * x0r - wk3i * x0i;
        a[j + 7] = wk3r * x0i + wk3i * x0r;
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        x0r = a[j + 8] + a[j + 10];
        x0i = a[j + 9] + a[j + 11];
        x1r = a[j + 8] - a[j + 10];
        x1i = a[j + 9] - a[j + 11];
        x2r = a[j + 12] + a[j + 14];
        x2i = a[j + 13] + a[j + 15];
        x3r = a[j + 12] - a[j + 14];
        x3i = a[j + 13] - a[j + 15];
        a[j + 8] = x0r + x2r;
        a[j + 9] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 12] = -wk2i * x0r - wk2r * x0i;
        a[j + 13] = -wk2i * x0i + wk2r * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 10] = wk1r * x0r - wk1i * x0i;
        a[j + 11] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 14] = wk3r * x0r - wk3i * x0i;
        a[j + 15] = wk3r * x0i + wk3i * x0r;
    }
}